

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O3

Orientations __thiscall QGridLayout::expandingDirections(QGridLayout *this)

{
  QGridLayoutPrivate *this_00;
  int hSpacing;
  int vSpacing;
  QFlagsStorageHelper<Qt::Orientation,_4> QVar1;
  QGridLayoutPrivate *pQVar2;
  QGridLayoutPrivate *d;
  
  this_00 = *(QGridLayoutPrivate **)&(this->super_QLayout).field_0x8;
  hSpacing = this_00->horizontalSpacing;
  pQVar2 = this_00;
  if (hSpacing < 0) {
    hSpacing = qSmartSpacing(&this->super_QLayout,PM_LayoutHorizontalSpacing);
    pQVar2 = *(QGridLayoutPrivate **)&(this->super_QLayout).field_0x8;
  }
  vSpacing = pQVar2->verticalSpacing;
  if (vSpacing < 0) {
    vSpacing = qSmartSpacing(&this->super_QLayout,PM_LayoutVerticalSpacing);
  }
  QVar1.super_QFlagsStorage<Qt::Orientation>.i =
       (QFlagsStorage<Qt::Orientation>)
       QGridLayoutPrivate::expandingDirections(this_00,hSpacing,vSpacing);
  return (QFlagsStorageHelper<Qt::Orientation,_4>)
         (QFlagsStorageHelper<Qt::Orientation,_4>)QVar1.super_QFlagsStorage<Qt::Orientation>.i;
}

Assistant:

Qt::Orientations QGridLayout::expandingDirections() const
{
    Q_D(const QGridLayout);
    return d->expandingDirections(horizontalSpacing(), verticalSpacing());
}